

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O0

TsStatus_t
ts_message_decode(TsMessageRef_t message,TsEncoder_t encoder,uint8_t *buffer,size_t buffer_size)

{
  cJSON *pcStack_38;
  TsStatus_t status;
  cJSON *cjson;
  size_t buffer_size_local;
  uint8_t *buffer_local;
  TsEncoder_t encoder_local;
  TsMessageRef_t message_local;
  
  if (message == (TsMessageRef_t)0x0) {
    message_local._4_4_ = TsStatusErrorPreconditionFailed;
  }
  else if ((encoder == TsEncoderDebug) || (encoder != TsEncoderJson)) {
    message_local._4_4_ = TsStatusErrorNotImplemented;
  }
  else if (buffer == (uint8_t *)0x0) {
    message_local._4_4_ = TsStatusError;
  }
  else {
    pcStack_38 = (cJSON *)cJSON_Parse(buffer);
    if (pcStack_38->type == 0x40) {
      pcStack_38 = pcStack_38->child;
    }
    message_local._4_4_ = ts_message_decode_json(message,pcStack_38);
    cJSON_Delete(pcStack_38);
  }
  return message_local._4_4_;
}

Assistant:

TsStatus_t ts_message_decode(TsMessageRef_t message, TsEncoder_t encoder, uint8_t *buffer, size_t buffer_size)
{
	/* check preconditions */
	if (message == NULL) {
		return TsStatusErrorPreconditionFailed;
	}

	/* perform encoding */
	switch (encoder) {

	case TsEncoderJson: {

		if (buffer == NULL) {
			return TsStatusErrorBadRequest;
		}

		cJSON *cjson = cJSON_Parse((const char *) buffer);
		if (cjson->type == cJSON_Object) {
			cjson = cjson->child;
		}
		TsStatus_t status = ts_message_decode_json(message, cjson);
		cJSON_Delete(cjson);

		return status;
	}

	case TsEncoderCbor:
		/* not implemented */
		/* fallthrough */

	case TsEncoderDebug:
	default:
		/* do nothing */
		break;
	}
	return TsStatusErrorNotImplemented;
}